

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

char * __thiscall tetgenio::readline(tetgenio *this,char *string,FILE *infile,int *linenumber)

{
  byte *pbVar1;
  ulong uVar2;
  
  do {
    pbVar1 = (byte *)fgets(string,0x7ff,(FILE *)infile);
    if (linenumber != (int *)0x0) {
      *linenumber = *linenumber + 1;
    }
    if (pbVar1 == (byte *)0x0) {
      return (char *)0x0;
    }
    while( true ) {
      uVar2 = (ulong)*pbVar1;
      if (0x20 < uVar2) {
        return (char *)pbVar1;
      }
      if ((0x100000200U >> (uVar2 & 0x3f) & 1) == 0) break;
      pbVar1 = pbVar1 + 1;
    }
  } while ((0x2401UL >> (uVar2 & 0x3f) & 1) != 0);
  return (char *)pbVar1;
}

Assistant:

char* tetgenio::readline(char *string, FILE *infile, int *linenumber)
{
  char *result;

  // Search for a non-empty line.
  do {
    result = fgets(string, INPUTLINESIZE - 1, infile);
    if (linenumber) (*linenumber)++;
    if (result == (char *) NULL) {
      return (char *) NULL;
    }
    // Skip white spaces.
    while ((*result == ' ') || (*result == '\t')) result++;
    // If it's end of line, read another line and try again.
  } while ((*result == '\0') || (*result == '\r') || (*result == '\n'));
  return result;
}